

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPA.cpp
# Opt level: O2

RealType __thiscall OpenMD::NPA::calcConservedQuantity(NPA *this)

{
  Thermo *this_00;
  double dVar1;
  double dVar2;
  double dVar3;
  RealType RVar4;
  double dVar5;
  RealType RVar6;
  undefined1 auVar7 [16];
  SquareMatrix<double,_3> tmp;
  SquareMatrix3<double> local_100;
  RectMatrix<double,_3U,_3U> local_b8;
  RectMatrix<double,_3U,_3U> local_70;
  
  (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator[0x18])();
  (this->super_NPT).NkBT =
       (double)((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.info_)->
               nGlobalIntegrableObjects_ * 8.31451e-07 * (this->super_NPT).targetTemp;
  this_00 = &(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.thermo;
  RVar4 = Thermo::getTotalEnergy(this_00);
  SquareMatrix3<double>::transpose(&local_100,&this->eta);
  operator*((SquareMatrix3<double> *)&local_b8,&local_100,&this->eta);
  RectMatrix<double,_3U,_3U>::operator=(&local_70,&local_b8);
  dVar5 = SquareMatrix<double,_3>::trace((SquareMatrix<double,_3> *)&local_70);
  dVar1 = (this->super_NPT).NkBT;
  dVar2 = (this->super_NPT).targetPressure;
  dVar3 = (this->super_NPT).tb2;
  RVar6 = Thermo::getVolume(this_00);
  auVar7._0_8_ = dVar1 * dVar3 * dVar5;
  auVar7._8_8_ = (RVar6 * dVar2) / 163882576.0;
  auVar7 = divpd(auVar7,_DAT_00245160);
  return auVar7._8_8_ + RVar4 + auVar7._0_8_;
}

Assistant:

RealType NPA::calcConservedQuantity() {
    loadEta();

    // We need NkBT a lot, so just set it here: This is the RAW number
    // of integrableObjects, so no subtraction or addition of constraints or
    // orientational degrees of freedom:
    NkBT = info_->getNGlobalIntegrableObjects() * Constants::kB * targetTemp;

    RealType conservedQuantity;
    RealType totalEnergy;
    RealType barostat_kinetic;
    RealType barostat_potential;
    RealType trEta;

    totalEnergy = thermo.getTotalEnergy();

    SquareMatrix<RealType, 3> tmp = eta.transpose() * eta;
    trEta                         = tmp.trace();

    barostat_kinetic = NkBT * tb2 * trEta / (2.0 * Constants::energyConvert);

    barostat_potential =
        (targetPressure * thermo.getVolume() / Constants::pressureConvert) /
        Constants::energyConvert;

    conservedQuantity = totalEnergy + barostat_kinetic + barostat_potential;

    return conservedQuantity;
  }